

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
csv::get_col_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,csv *this,string_view filename,CSVFormat *format)

{
  bool bVar1;
  CSVFormat *pCVar2;
  CSVFormat *this_00;
  string_view head_00;
  string_view filename_00;
  CSVFormat local_108;
  undefined1 local_b0 [16];
  vector<char,_std::allocator<char>_> local_a0;
  csv *local_88;
  size_t sStack_80;
  CSVGuessResult local_6c;
  CSVGuessResult guess_result;
  undefined1 local_48 [8];
  string head;
  CSVFormat *format_local;
  string_view filename_local;
  
  this_00 = (CSVFormat *)filename._M_str;
  pCVar2 = this_00;
  head.field_2._8_8_ = this_00;
  internals::get_csv_head_abi_cxx11_((string *)local_48,(internals *)this,filename);
  bVar1 = CSVFormat::guess_delim(this_00);
  if (bVar1) {
    local_88 = this;
    sStack_80 = filename._M_len;
    CSVFormat::get_possible_delims(&local_a0,this_00);
    filename_00._M_str = (char *)&local_a0;
    filename_00._M_len = sStack_80;
    local_6c = guess_format(local_88,filename_00,&pCVar2->possible_delimiters);
    std::vector<char,_std::allocator<char>_>::~vector(&local_a0);
    pCVar2 = CSVFormat::delimiter(this_00,local_6c.delim);
    CSVFormat::header_row(pCVar2,local_6c.header_row);
  }
  local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
  CSVFormat::CSVFormat(&local_108,this_00);
  head_00._M_str = (char *)&local_108;
  head_00._M_len = local_b0._8_8_;
  internals::_get_col_names_abi_cxx11_
            (__return_storage_ptr__,(internals *)local_b0._0_8_,head_00,format);
  CSVFormat::~CSVFormat(&local_108);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE std::vector<std::string> get_col_names(csv::string_view filename, CSVFormat format) {
        auto head = internals::get_csv_head(filename);

        /** Guess delimiter and header row */
        if (format.guess_delim()) {
            auto guess_result = guess_format(filename, format.get_possible_delims());
            format.delimiter(guess_result.delim).header_row(guess_result.header_row);
        }

        return internals::_get_col_names(head, format);
    }